

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O1

success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
toml::ok<std::__cxx11::string>
          (success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,toml *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v)

{
  toml *ptVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_type sVar3;
  toml *local_20;
  size_type local_10;
  undefined8 uStack_8;
  
  ptVar1 = this + 0x10;
  if (*(toml **)this == ptVar1) {
    local_10 = *(size_type *)ptVar1;
    uStack_8 = *(undefined8 *)(this + 0x18);
    local_20 = (toml *)&local_10;
  }
  else {
    local_10 = *(size_type *)ptVar1;
    local_20 = *(toml **)this;
  }
  sVar3 = *(size_type *)(this + 8);
  *(toml **)this = ptVar1;
  *(undefined8 *)(this + 8) = 0;
  this[0x10] = (toml)0x0;
  paVar2 = &(__return_storage_ptr__->value).field_2;
  (__return_storage_ptr__->value)._M_dataplus._M_p = (pointer)paVar2;
  if (local_20 == (toml *)&local_10) {
    paVar2->_M_allocated_capacity = local_10;
    *(undefined8 *)((long)&(__return_storage_ptr__->value).field_2 + 8) = uStack_8;
  }
  else {
    (__return_storage_ptr__->value)._M_dataplus._M_p = (pointer)local_20;
    (__return_storage_ptr__->value).field_2._M_allocated_capacity = local_10;
  }
  (__return_storage_ptr__->value)._M_string_length = sVar3;
  return __return_storage_ptr__;
}

Assistant:

success<typename std::decay<T>::type> ok(T&& v)
{
    return success<typename std::decay<T>::type>(std::forward<T>(v));
}